

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O2

void __thiscall QPDFNumberTreeObjectHelper::iterator::updateIValue(iterator *this)

{
  bool bVar1;
  pointer pTVar2;
  longlong lVar3;
  element_type p;
  NNTreeIterator local_78;
  
  bVar1 = NNTreeIterator::valid
                    ((this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (bVar1) {
    NNTreeIterator::NNTreeIterator
              (&local_78,
               (this->impl).super___shared_ptr<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    pTVar2 = NNTreeIterator::operator->(&local_78);
    lVar3 = QPDFObjectHandle::getIntValue(&pTVar2->first);
    (this->ivalue).first = lVar3;
    pTVar2 = NNTreeIterator::operator->(&local_78);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&(this->ivalue).second,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&pTVar2->second);
    NNTreeIterator::~NNTreeIterator(&local_78);
  }
  else {
    (this->ivalue).first = 0;
    local_78._vptr_NNTreeIterator = (_func_int **)0x0;
    local_78.impl = (NNTreeImpl *)0x0;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&(this->ivalue).second,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78.impl);
  }
  return;
}

Assistant:

void
QPDFNumberTreeObjectHelper::iterator::updateIValue()
{
    if (impl->valid()) {
        auto p = *impl;
        this->ivalue.first = p->first.getIntValue();
        this->ivalue.second = p->second;
    } else {
        this->ivalue.first = 0;
        this->ivalue.second = QPDFObjectHandle();
    }
}